

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

Shift __thiscall
dg::vr::RelationsAnalyzer::getShift
          (RelationsAnalyzer *this,
          vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          *changeLocations,VectorSet<const_llvm::Value_*> *froms)

{
  long lVar1;
  Shift SVar2;
  bool bVar3;
  Shift SVar4;
  Shift SVar5;
  pointer ppVVar6;
  Value *local_38;
  
  ppVVar6 = (changeLocations->
            super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  SVar2 = EQ;
  do {
    do {
      SVar5 = SVar2;
      ppVVar6 = ppVVar6 + 1;
      if (ppVVar6 ==
          (changeLocations->
          super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        return SVar5;
      }
      lVar1 = *(long *)((long)((*((*ppVVar6)->predecessors).
                                 super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->op)._M_t.
                              super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>
                              ._M_t + 0x10);
      local_38 = *(Value **)(lVar1 + -0x20);
      bVar3 = VectorSet<llvm::Value_const*>::contains<llvm::Value_const*>
                        ((VectorSet<llvm::Value_const*> *)froms,&local_38);
      if (!bVar3) {
        return UNKNOWN;
      }
      SVar4 = getShift(*(Value **)(lVar1 + -0x40),froms);
      SVar2 = SVar4;
    } while (SVar5 == EQ);
    if (SVar5 == UNKNOWN) {
      return UNKNOWN;
    }
    SVar2 = SVar5;
  } while (SVar5 == SVar4);
  return UNKNOWN;
}

Assistant:

RelationsAnalyzer::Shift RelationsAnalyzer::getShift(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms) const {
    Shift shift = Shift::EQ;
    // first location is the tree predecessor
    for (auto it = std::next(changeLocations.begin());
         it != changeLocations.end(); ++it) {
        const VRLocation *loc = *it;
        assert(loc->predsSize() == 1);

        V inst = static_cast<VRInstruction *>(loc->getPredEdge(0)->op.get())
                         ->getInstruction();
        assert(inst);
        assert(llvm::isa<llvm::StoreInst>(inst));
        const llvm::StoreInst *store = llvm::cast<llvm::StoreInst>(inst);
        if (!froms.contains(store->getPointerOperand()))
            return Shift::UNKNOWN;

        const auto *what = store->getValueOperand();

        Shift current = getShift(what, froms);

        if (shift == Shift::UNKNOWN)
            return shift;
        if (shift == Shift::EQ)
            shift = current;
        else if (shift != current)
            return Shift::UNKNOWN;
    }
    return shift;
}